

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::set_peer_classes
          (session_impl *this,peer_class_set *s,address *a,socket_type_t st)

{
  uint uVar1;
  ulong uVar2;
  peer_class *ppVar3;
  undefined7 in_register_00000009;
  peer_class_t i;
  peer_class_t c;
  
  uVar1 = ip_filter::access(&this->m_peer_class_filter,(char *)a,(int)a);
  uVar2 = (ulong)set_peer_classes::mapping.
                 super_array<libtorrent::peer_class_type_filter::socket_type_t,_10UL>._M_elems
                 [CONCAT71(in_register_00000009,st) & 0xffffffff];
  if (uVar2 < 6) {
    uVar1 = uVar1 & (this->m_peer_class_type_filter).m_peer_class_type_mask._M_elems[uVar2] |
            (this->m_peer_class_type_filter).m_peer_class_type._M_elems[uVar2];
  }
  c.m_val = 0;
  for (; uVar1 != 0; uVar1 = uVar1 >> 1) {
    if ((uVar1 & 1) != 0) {
      ppVar3 = peer_class_pool::at(&this->m_classes,c);
      if (ppVar3 != (peer_class *)0x0) {
        peer_class_set::add_class(s,&this->m_classes,c);
      }
    }
    c.m_val = c.m_val + 1;
  }
  return;
}

Assistant:

void session_impl::set_peer_classes(peer_class_set* s, address const& a, socket_type_t const st)
	{
		std::uint32_t peer_class_mask = m_peer_class_filter.access(a);

		using sock_t = peer_class_type_filter::socket_type_t;
		// assign peer class based on socket type
		static aux::array<sock_t, 10, socket_type_t> const mapping{{{
			sock_t::tcp_socket
			, sock_t::tcp_socket
			, sock_t::tcp_socket
			, sock_t::utp_socket
			, sock_t::i2p_socket
			, sock_t::rtc_socket
			, sock_t::ssl_tcp_socket
			, sock_t::ssl_tcp_socket
			, sock_t::ssl_tcp_socket
			, sock_t::ssl_utp_socket
		}}};
		sock_t const socket_type = mapping[st];
		// filter peer classes based on type
		peer_class_mask = m_peer_class_type_filter.apply(socket_type, peer_class_mask);

		for (peer_class_t i{0}; peer_class_mask; peer_class_mask >>= 1, ++i)
		{
			if ((peer_class_mask & 1) == 0) continue;

			// if you hit this assert, your peer class filter contains
			// a bitmask referencing a non-existent peer class
			TORRENT_ASSERT_PRECOND(m_classes.at(i));

			if (m_classes.at(i) == nullptr) continue;
			s->add_class(m_classes, i);
		}
	}